

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.hpp
# Opt level: O2

lock_handle<int,_std::shared_timed_mutex> * __thiscall
gmlc::libguarded::try_lock_handle<int,std::shared_timed_mutex>
          (lock_handle<int,_std::shared_timed_mutex> *__return_storage_ptr__,libguarded *this,
          int *obj,shared_timed_mutex *gmutex)

{
  bool bVar1;
  unique_lock<std::shared_timed_mutex> *this_00;
  unique_lock<std::shared_timed_mutex> local_50;
  unique_lock<std::shared_timed_mutex> local_40;
  unique_lock<std::shared_timed_mutex> local_30;
  
  bVar1 = std::__shared_mutex_pthread::try_lock((__shared_mutex_pthread *)obj);
  local_50._M_device = (mutex_type *)0x0;
  local_50._M_owns = false;
  if (bVar1) {
    this_00 = &local_30;
    local_30._M_device = (mutex_type *)0x0;
  }
  else {
    this_00 = &local_40;
    local_40._M_device = (mutex_type *)0x0;
    this = (libguarded *)0x0;
  }
  this_00->_M_owns = false;
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(this_00);
  __return_storage_ptr__->data = (pointer)this;
  (__return_storage_ptr__->m_handle_lock)._M_device = (mutex_type *)obj;
  (__return_storage_ptr__->m_handle_lock)._M_owns = bVar1;
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(&local_50);
  return __return_storage_ptr__;
}

Assistant:

lock_handle<T, M> try_lock_handle(T* obj, M& gmutex)
{
    typename lock_handle<T, M>::lock_type glock(gmutex, std::try_to_lock);
    if (glock.owns_lock()) {
        return lock_handle<T, M>(obj, std::move(glock));
    } else {
        return lock_handle<T, M>(nullptr, std::move(glock));
    }
}